

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDual.c
# Opt level: O1

Aig_Man_t *
Saig_ManDupDual(Aig_Man_t *pAig,Vec_Int_t *vDcFlops,int nDualPis,int fDualFfs,int fMiterFfs,
               int fComplPo,int fCheckZero,int fCheckOne)

{
  char *__s;
  void *pvVar1;
  uint uVar2;
  uint *__ptr;
  ulong *__s_00;
  Aig_Man_t *p;
  size_t sVar3;
  char *__dest;
  Vec_Ptr_t *pVVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  Aig_Obj_t *local_50;
  
  if (pAig->nTruePos < 1) {
    __assert_fail("Saig_ManPoNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigDual.c"
                  ,0x57,
                  "Aig_Man_t *Saig_ManDupDual(Aig_Man_t *, Vec_Int_t *, int, int, int, int, int, int)"
                 );
  }
  if ((nDualPis < 0) || (pAig->nTruePis < nDualPis)) {
    __assert_fail("nDualPis >= 0 && nDualPis <= Saig_ManPiNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigDual.c"
                  ,0x58,
                  "Aig_Man_t *Saig_ManDupDual(Aig_Man_t *, Vec_Int_t *, int, int, int, int, int, int)"
                 );
  }
  if ((vDcFlops != (Vec_Int_t *)0x0) && (vDcFlops->nSize != pAig->nRegs)) {
    __assert_fail("vDcFlops == NULL || Vec_IntSize(vDcFlops) == Aig_ManRegNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigDual.c"
                  ,0x59,
                  "Aig_Man_t *Saig_ManDupDual(Aig_Man_t *, Vec_Int_t *, int, int, int, int, int, int)"
                 );
  }
  lVar14 = (long)pAig->vObjs->nSize - (long)pAig->nDeleted;
  iVar12 = (int)lVar14;
  uVar2 = iVar12 * 2;
  __ptr = (uint *)malloc(0x10);
  uVar10 = 8;
  if (6 < uVar2 - 1) {
    uVar10 = uVar2;
  }
  __ptr[1] = 0;
  *__ptr = uVar10;
  if (uVar10 == 0) {
    __s_00 = (ulong *)0x0;
  }
  else {
    __s_00 = (ulong *)malloc((long)(int)uVar10 << 3);
  }
  *(ulong **)(__ptr + 2) = __s_00;
  __ptr[1] = uVar2;
  __dest = (char *)0x0;
  memset(__s_00,0,lVar14 * 0x10);
  p = Aig_ManStart(pAig->nObjs[6] + pAig->nObjs[5]);
  __s = pAig->pName;
  if (__s != (char *)0x0) {
    sVar3 = strlen(__s);
    __dest = (char *)malloc(sVar3 + 1);
    strcpy(__dest,__s);
  }
  p->pName = __dest;
  if (iVar12 < 1) {
LAB_006dcf6b:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
  }
  *__s_00 = (ulong)p->pConst1 ^ 1;
  __s_00[1] = (ulong)p->pConst1;
  pVVar4 = pAig->vCis;
  if (0 < pVVar4->nSize) {
    uVar15 = 0;
    do {
      pvVar1 = pVVar4->pArray[uVar15];
      if (uVar15 < (uint)nDualPis) {
        pAVar5 = Aig_ObjCreateCi(p);
        pAVar6 = Aig_ObjCreateCi(p);
      }
      else {
        iVar12 = pAig->nTruePis;
        pAVar7 = Aig_ObjCreateCi(p);
        if ((long)uVar15 < (long)iVar12) {
          pAVar5 = (Aig_Obj_t *)((ulong)pAVar7 ^ 1);
          pAVar6 = pAVar7;
        }
        else {
          pAVar6 = Aig_ObjCreateCi(p);
          if (vDcFlops == (Vec_Int_t *)0x0) {
            pAVar5 = (Aig_Obj_t *)((ulong)pAVar7 ^ (ulong)(fDualFfs == 0));
          }
          else {
            uVar13 = (uint)-pAig->nTruePis + uVar15;
            iVar12 = (int)uVar13;
            if ((iVar12 < 0) || (vDcFlops->nSize <= iVar12)) goto LAB_006dcf8a;
            pAVar5 = (Aig_Obj_t *)
                     ((ulong)(vDcFlops->pArray[uVar13 & 0xffffffff] == 0) ^ (ulong)pAVar7);
          }
        }
      }
      iVar12 = *(int *)((long)pvVar1 + 0x24);
      pAVar7 = Aig_And(p,pAVar5,(Aig_Obj_t *)((ulong)pAVar6 ^ 1));
      if ((iVar12 < 0) || (uVar10 = iVar12 * 2, (int)uVar2 <= (int)uVar10)) goto LAB_006dcf6b;
      __s_00[uVar10] = (ulong)pAVar7;
      iVar12 = *(int *)((long)pvVar1 + 0x24);
      pAVar7 = Aig_And(p,pAVar6,(Aig_Obj_t *)((ulong)pAVar5 ^ 1));
      if ((iVar12 < 0) || (uVar10 = iVar12 * 2 + 1, (int)uVar2 <= (int)uVar10)) goto LAB_006dcf6b;
      __s_00[uVar10] = (ulong)pAVar7;
      uVar15 = uVar15 + 1;
      pVVar4 = pAig->vCis;
    } while ((long)uVar15 < (long)pVVar4->nSize);
  }
  pVVar4 = pAig->vObjs;
  if (0 < pVVar4->nSize) {
    lVar14 = 0;
    do {
      pvVar1 = pVVar4->pArray[lVar14];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        uVar15 = *(ulong *)((long)pvVar1 + 8);
        if (uVar15 == 0) {
          uVar10 = 0xfffffffe;
        }
        else {
          uVar10 = *(int *)((uVar15 & 0xfffffffffffffffe) + 0x24) * 2;
        }
        if (uVar2 <= uVar10) goto LAB_006dcf4c;
        if (uVar15 == 0) {
          uVar11 = 0xffffffff;
        }
        else {
          uVar11 = *(int *)((uVar15 & 0xfffffffffffffffe) + 0x24) * 2 + 1;
        }
        if (uVar2 <= uVar11) goto LAB_006dcf4c;
        pAVar7 = (Aig_Obj_t *)__s_00[uVar10];
        local_50 = (Aig_Obj_t *)__s_00[uVar11];
        if ((uVar15 & 1) != 0) {
          pAVar6 = Aig_Or(p,pAVar7,local_50);
          pAVar5 = Aig_And(p,local_50,pAVar6);
          local_50 = Aig_And(p,pAVar7,pAVar6);
          pAVar7 = pAVar5;
        }
        uVar15 = *(ulong *)((long)pvVar1 + 0x10);
        if (uVar15 == 0) {
          uVar10 = 0xfffffffe;
        }
        else {
          uVar10 = *(int *)((uVar15 & 0xfffffffffffffffe) + 0x24) * 2;
        }
        if (uVar2 <= uVar10) goto LAB_006dcf4c;
        if (uVar15 == 0) {
          uVar11 = 0xffffffff;
        }
        else {
          uVar11 = *(int *)((uVar15 & 0xfffffffffffffffe) + 0x24) * 2 + 1;
        }
        if (uVar2 <= uVar11) goto LAB_006dcf4c;
        pAVar6 = (Aig_Obj_t *)__s_00[uVar10];
        pAVar5 = (Aig_Obj_t *)__s_00[uVar11];
        pAVar9 = pAVar6;
        if ((uVar15 & 1) != 0) {
          pAVar8 = Aig_Or(p,pAVar6,pAVar5);
          pAVar9 = Aig_And(p,pAVar5,pAVar8);
          pAVar5 = Aig_And(p,pAVar6,pAVar8);
        }
        iVar12 = *(int *)((long)pvVar1 + 0x24);
        pAVar7 = Aig_Or(p,pAVar7,pAVar9);
        if ((iVar12 < 0) || (uVar10 = iVar12 * 2, (int)uVar2 <= (int)uVar10)) goto LAB_006dcf6b;
        __s_00[uVar10] = (ulong)pAVar7;
        iVar12 = *(int *)((long)pvVar1 + 0x24);
        pAVar7 = Aig_And(p,local_50,pAVar5);
        if ((iVar12 < 0) || (uVar10 = iVar12 * 2 + 1, (int)uVar2 <= (int)uVar10)) goto LAB_006dcf6b;
        __s_00[uVar10] = (ulong)pAVar7;
      }
      lVar14 = lVar14 + 1;
      pVVar4 = pAig->vObjs;
    } while (lVar14 < pVVar4->nSize);
  }
  pAVar7 = (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
  if (fMiterFfs == 0) {
    if (0 < pAig->nTruePos) {
      lVar14 = 0;
      do {
        if (pAig->vCos->nSize <= lVar14) goto LAB_006dcf4c;
        uVar15 = *(ulong *)((long)pAig->vCos->pArray[lVar14] + 8);
        if (uVar15 == 0) {
          uVar2 = 0xfffffffe;
        }
        else {
          uVar2 = *(int *)((uVar15 & 0xfffffffffffffffe) + 0x24) * 2;
        }
        if (((int)uVar2 < 0) || ((int)__ptr[1] <= (int)uVar2)) goto LAB_006dcf4c;
        if (uVar15 == 0) {
          uVar10 = 0xffffffff;
        }
        else {
          uVar10 = *(int *)((uVar15 & 0xfffffffffffffffe) + 0x24) * 2 + 1;
        }
        if (((int)uVar10 < 0) || ((int)__ptr[1] <= (int)uVar10)) goto LAB_006dcf4c;
        pAVar6 = *(Aig_Obj_t **)(*(long *)(__ptr + 2) + (ulong)uVar2 * 8);
        pAVar5 = *(Aig_Obj_t **)(*(long *)(__ptr + 2) + (ulong)uVar10 * 8);
        pAVar9 = pAVar6;
        if ((uVar15 & 1) != 0) {
          pAVar8 = Aig_Or(p,pAVar6,pAVar5);
          pAVar9 = Aig_And(p,pAVar5,pAVar8);
          pAVar5 = Aig_And(p,pAVar6,pAVar8);
        }
        if (fCheckZero == 0) {
          pAVar9 = (Aig_Obj_t *)((ulong)pAVar9 ^ 1);
          if (fCheckOne == 0) {
            pAVar5 = (Aig_Obj_t *)((ulong)pAVar5 ^ 1);
          }
        }
        else {
          pAVar5 = (Aig_Obj_t *)((ulong)pAVar5 ^ 1);
        }
        pAVar6 = Aig_And(p,pAVar9,pAVar5);
        pAVar7 = Aig_Or(p,pAVar7,pAVar6);
        lVar14 = lVar14 + 1;
      } while (lVar14 < pAig->nTruePos);
    }
  }
  else if (0 < pAig->nRegs) {
    iVar12 = 0;
    do {
      uVar2 = pAig->nTruePos + iVar12;
      if (((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) goto LAB_006dcf4c;
      uVar15 = *(ulong *)((long)pAig->vCos->pArray[uVar2] + 8);
      if (uVar15 == 0) {
        uVar2 = 0xfffffffe;
      }
      else {
        uVar2 = *(int *)((uVar15 & 0xfffffffffffffffe) + 0x24) * 2;
      }
      if (((int)uVar2 < 0) || ((int)__ptr[1] <= (int)uVar2)) goto LAB_006dcf4c;
      if (uVar15 == 0) {
        uVar10 = 0xffffffff;
      }
      else {
        uVar10 = *(int *)((uVar15 & 0xfffffffffffffffe) + 0x24) * 2 + 1;
      }
      if (((int)uVar10 < 0) || ((int)__ptr[1] <= (int)uVar10)) goto LAB_006dcf4c;
      pAVar6 = *(Aig_Obj_t **)(*(long *)(__ptr + 2) + (ulong)uVar2 * 8);
      pAVar5 = *(Aig_Obj_t **)(*(long *)(__ptr + 2) + (ulong)uVar10 * 8);
      pAVar9 = pAVar6;
      if ((uVar15 & 1) != 0) {
        pAVar8 = Aig_Or(p,pAVar6,pAVar5);
        pAVar9 = Aig_And(p,pAVar5,pAVar8);
        pAVar5 = Aig_And(p,pAVar6,pAVar8);
      }
      if (fCheckZero == 0) {
        pAVar9 = (Aig_Obj_t *)((ulong)pAVar9 ^ 1);
        if (fCheckOne == 0) {
          pAVar5 = (Aig_Obj_t *)((ulong)pAVar5 ^ 1);
        }
      }
      else {
        pAVar5 = (Aig_Obj_t *)((ulong)pAVar5 ^ 1);
      }
      pAVar6 = Aig_And(p,pAVar9,pAVar5);
      pAVar7 = Aig_Or(p,pAVar7,pAVar6);
      iVar12 = iVar12 + 1;
    } while (iVar12 < pAig->nRegs);
  }
  Aig_ObjCreateCo(p,(Aig_Obj_t *)((long)fComplPo ^ (ulong)pAVar7));
  iVar12 = pAig->nRegs;
  if (0 < iVar12) {
    lVar14 = 0;
    do {
      uVar15 = (ulong)(uint)pAig->nTruePos + lVar14;
      iVar12 = (int)uVar15;
      if ((iVar12 < 0) || (pAig->vCos->nSize <= iVar12)) {
LAB_006dcf4c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar15 = *(ulong *)((long)pAig->vCos->pArray[uVar15 & 0xffffffff] + 8);
      if (uVar15 == 0) {
        uVar2 = 0xfffffffe;
      }
      else {
        uVar2 = *(int *)((uVar15 & 0xfffffffffffffffe) + 0x24) * 2;
      }
      if (((int)uVar2 < 0) || ((int)__ptr[1] <= (int)uVar2)) goto LAB_006dcf4c;
      if (uVar15 == 0) {
        uVar13 = 0xffffffff;
      }
      else {
        uVar13 = (ulong)(*(int *)((uVar15 & 0xfffffffffffffffe) + 0x24) * 2 + 1);
      }
      if (((int)uVar13 < 0) || ((int)__ptr[1] <= (int)uVar13)) goto LAB_006dcf4c;
      pAVar7 = *(Aig_Obj_t **)(*(long *)(__ptr + 2) + (ulong)uVar2 * 8);
      pAVar6 = *(Aig_Obj_t **)(*(long *)(__ptr + 2) + uVar13 * 8);
      pAVar5 = pAVar7;
      if ((uVar15 & 1) != 0) {
        pAVar9 = Aig_Or(p,pAVar7,pAVar6);
        pAVar5 = Aig_And(p,pAVar6,pAVar9);
        pAVar6 = Aig_And(p,pAVar7,pAVar9);
      }
      bVar16 = fDualFfs == 0;
      if (vDcFlops != (Vec_Int_t *)0x0) {
        if (vDcFlops->nSize <= lVar14) {
LAB_006dcf8a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        bVar16 = vDcFlops->pArray[lVar14] == 0;
      }
      Aig_ObjCreateCo(p,(Aig_Obj_t *)((ulong)bVar16 ^ (ulong)pAVar5));
      Aig_ObjCreateCo(p,pAVar6);
      lVar14 = lVar14 + 1;
      iVar12 = pAig->nRegs;
    } while (lVar14 < iVar12);
  }
  Aig_ManSetRegNum(p,iVar12 * 2);
  Aig_ManCleanup(p);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return p;
}

Assistant:

Aig_Man_t * Saig_ManDupDual( Aig_Man_t * pAig, Vec_Int_t * vDcFlops, int nDualPis, int fDualFfs, int fMiterFfs, int fComplPo, int fCheckZero, int fCheckOne )
{
    Vec_Ptr_t * vCopies;
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pObj, * pTemp0, * pTemp1, * pTemp2, * pTemp3, * pCare, * pMiter;
    int i;
    assert( Saig_ManPoNum(pAig) > 0 );
    assert( nDualPis >= 0 && nDualPis <= Saig_ManPiNum(pAig) );
    assert( vDcFlops == NULL || Vec_IntSize(vDcFlops) == Aig_ManRegNum(pAig) );
    vCopies = Vec_PtrStart( 2*Aig_ManObjNum(pAig) );
    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    // map the constant node
    Saig_ObjSetDual( vCopies, 0, 0, Aig_ManConst0(pAigNew) );
    Saig_ObjSetDual( vCopies, 0, 1, Aig_ManConst1(pAigNew) );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
    {
        if ( i < nDualPis )
        {
            pTemp0 = Aig_ObjCreateCi( pAigNew );
            pTemp1 = Aig_ObjCreateCi( pAigNew );
        }
        else if ( i < Saig_ManPiNum(pAig) )
        {
            pTemp1 = Aig_ObjCreateCi( pAigNew );
            pTemp0 = Aig_Not( pTemp1 );
        }
        else
        {
            pTemp0 = Aig_ObjCreateCi( pAigNew );
            pTemp1 = Aig_ObjCreateCi( pAigNew );
            if ( vDcFlops )
                pTemp0 = Aig_NotCond( pTemp0, !Vec_IntEntry(vDcFlops, i-Saig_ManPiNum(pAig)) );
            else
                pTemp0 = Aig_NotCond( pTemp0, !fDualFfs );
        }
        Saig_ObjSetDual( vCopies, Aig_ObjId(pObj), 0, Aig_And(pAigNew, pTemp0, Aig_Not(pTemp1)) );
        Saig_ObjSetDual( vCopies, Aig_ObjId(pObj), 1, Aig_And(pAigNew, pTemp1, Aig_Not(pTemp0)) );
    }
    // create internal nodes
    Aig_ManForEachNode( pAig, pObj, i )
    {
        Saig_ObjDualFanin( pAigNew, vCopies, pObj, 0, &pTemp0, &pTemp1 );
        Saig_ObjDualFanin( pAigNew, vCopies, pObj, 1, &pTemp2, &pTemp3 );
        Saig_ObjSetDual( vCopies, Aig_ObjId(pObj), 0, Aig_Or (pAigNew, pTemp0, pTemp2) );
        Saig_ObjSetDual( vCopies, Aig_ObjId(pObj), 1, Aig_And(pAigNew, pTemp1, pTemp3) );
    }
    // create miter and flops
    pMiter = Aig_ManConst0(pAigNew);
    if ( fMiterFfs )
    {
        Saig_ManForEachLi( pAig, pObj, i )
        {
            Saig_ObjDualFanin( pAigNew, vCopies, pObj, 0, &pTemp0, &pTemp1 );
            if ( fCheckZero )
            {
                pCare  = Aig_And( pAigNew, pTemp0, Aig_Not(pTemp1) );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
            else if ( fCheckOne )
            {
                pCare  = Aig_And( pAigNew, Aig_Not(pTemp0), pTemp1 );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
            else // check X
            {
                pCare  = Aig_And( pAigNew, Aig_Not(pTemp0), Aig_Not(pTemp1) );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
        }
    }
    else
    {
        Saig_ManForEachPo( pAig, pObj, i )
        {
            Saig_ObjDualFanin( pAigNew, vCopies, pObj, 0, &pTemp0, &pTemp1 );
            if ( fCheckZero )
            {
                pCare  = Aig_And( pAigNew, pTemp0, Aig_Not(pTemp1) );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
            else if ( fCheckOne )
            {
                pCare  = Aig_And( pAigNew, Aig_Not(pTemp0), pTemp1 );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
            else // check X
            {
                pCare  = Aig_And( pAigNew, Aig_Not(pTemp0), Aig_Not(pTemp1) );
                pMiter = Aig_Or( pAigNew, pMiter, pCare );
            }
        }
    }
    // create PO
    pMiter = Aig_NotCond( pMiter, fComplPo );
    Aig_ObjCreateCo( pAigNew, pMiter );
    // create flops
    Saig_ManForEachLi( pAig, pObj, i )
    {
        Saig_ObjDualFanin( pAigNew, vCopies, pObj, 0, &pTemp0, &pTemp1 );
        if ( vDcFlops )
            pTemp0 = Aig_NotCond( pTemp0, !Vec_IntEntry(vDcFlops, i) );
        else
            pTemp0 = Aig_NotCond( pTemp0, !fDualFfs );
        Aig_ObjCreateCo( pAigNew, pTemp0 );
        Aig_ObjCreateCo( pAigNew, pTemp1 );
    }
    // set the flops
    Aig_ManSetRegNum( pAigNew, 2 * Aig_ManRegNum(pAig) );
    Aig_ManCleanup( pAigNew );
    Vec_PtrFree( vCopies );
    return pAigNew;
}